

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxSerialize.cpp
# Opt level: O2

void __thiscall Jinx::Impl::BinaryReader::Read(BinaryReader *this,String *val)

{
  size_t *pos;
  char *__s;
  uint32_t length;
  char buffer [1024];
  
  pos = &this->m_pos;
  Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               pos,&length,4);
  if ((ulong)length < 0x3ff) {
    Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pos,buffer,(ulong)length + 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::assign
              (val,buffer);
  }
  else {
    __s = (char *)MemAllocate((ulong)(length + 2));
    Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pos,__s,(ulong)(length + 1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::assign
              (val,__s);
    MemFree(__s,(ulong)(length + 1));
  }
  return;
}

Assistant:

inline_t void BinaryReader::Read(String * val)
	{
		uint32_t length;
		m_buffer->Read(&m_pos, &length, sizeof(length));
		if (length < (1024 - 1))
		{
			char buffer[1024];
			m_buffer->Read(&m_pos, buffer, length + 1);
			*val = buffer;
		}
		else
		{
			char * buffer = (char *)MemAllocate(length + 2);
			m_buffer->Read(&m_pos, buffer, length + 1);
			*val = buffer;
			MemFree(buffer, length + 1);
		}
	}